

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  size_t sVar3;
  char *p;
  char *pcVar4;
  uint32_t uc;
  char *ss;
  uint local_50;
  wchar_t local_4c;
  size_t local_48;
  char *local_40;
  wchar_t local_34;
  
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  if (paVar2 == (archive_string *)0x0) {
LAB_0067a2d7:
    local_4c = L'\xffffffff';
  }
  else {
    p = as->s + as->length;
    pcVar4 = as->s + (as->buffer_length - 1);
    local_4c = L'\0';
    local_40 = (char *)_p;
    do {
      while (wVar1 = _utf8_to_unicode(&local_50,(char *)_p,len), wVar1 != L'\x03') {
        if (wVar1 < L'\x01') goto LAB_0067a17b;
LAB_0067a16c:
        _p = (void *)((long)_p + (ulong)(uint)wVar1);
        len = len - (uint)wVar1;
      }
      if ((local_50 & 0xfffff800) != 0xd800) goto LAB_0067a16c;
      wVar1 = L'\xfffffffd';
LAB_0067a17b:
      if (local_40 < _p) {
        local_48 = (long)_p - (long)local_40;
        if (pcVar4 < p + local_48) {
          as->length = (long)p - (long)as->s;
          paVar2 = archive_string_ensure(as,len + as->buffer_length + 1);
          if (paVar2 == (archive_string *)0x0) goto LAB_0067a2d7;
          p = as->s + as->length;
          pcVar4 = as->s + (as->buffer_length - 1);
        }
        memcpy(p,local_40,local_48);
        p = p + local_48;
      }
      if (L'\xffffffff' < wVar1) break;
      if ((local_50 & 0xfffff800) == 0xd800 && wVar1 == L'\xfffffffd') {
        wVar1 = cesu8_to_unicode(&local_50,(char *)_p,len);
      }
      local_34 = -wVar1;
      if (L'\0' < wVar1) {
        local_34 = wVar1;
      }
      if (wVar1 < L'\0') {
        local_4c = L'\xffffffff';
      }
      local_40 = (char *)CONCAT44(local_40._4_4_,local_50);
      sVar3 = unicode_to_utf8(p,(long)pcVar4 - (long)p,local_50);
      if (sVar3 == 0) {
        local_48 = len + 1;
        do {
          as->length = (long)p - (long)as->s;
          paVar2 = archive_string_ensure(as,as->buffer_length + local_48);
          if (paVar2 == (archive_string *)0x0) goto LAB_0067a2d7;
          p = as->s + as->length;
          pcVar4 = as->s + (as->buffer_length - 1);
          sVar3 = unicode_to_utf8(p,(long)pcVar4 - (long)p,(uint32_t)local_40);
        } while (sVar3 == 0);
      }
      p = p + sVar3;
      _p = (void *)((long)_p + (ulong)(uint)local_34);
      len = len - (uint)local_34;
      local_40 = (char *)_p;
    } while (wVar1 != L'\0');
    as->length = (long)p - (long)as->s;
    *p = '\0';
  }
  return local_4c;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	int n, ret = 0;

	(void)sc; /* UNUSED */

	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length -1;
	do {
		uint32_t uc;
		const char *ss = s;
		size_t w;

		/*
		 * Forward byte sequence until a conversion of that is needed.
		 */
		while ((n = utf8_to_unicode(&uc, s, len)) > 0) {
			s += n;
			len -= n;
		}
		if (ss < s) {
			if (p + (s - ss) > endp) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}

			memcpy(p, ss, s - ss);
			p += s - ss;
		}

		/*
		 * If n is negative, current byte sequence needs a replacement.
		 */
		if (n < 0) {
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				/* Current byte sequence may be CESU-8. */
				n = cesu8_to_unicode(&uc, s, len);
			}
			if (n < 0) {
				ret = -1;
				n *= -1;/* Use a replaced unicode character. */
			}

			/* Rebuild UTF-8 byte sequence. */
			while ((w = unicode_to_utf8(p, endp - p, uc)) == 0) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}
			p += w;
			s += n;
			len -= n;
		}
	} while (n > 0);
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret);
}